

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

json_iterator __thiscall JSONNode::begin(JSONNode *this)

{
  JSONNode **starter;
  JSONNode *in_RSI;
  JSONNode *this_local;
  
  makeUniqueInternal(in_RSI);
  starter = internalJSONNode::begin(in_RSI->internal);
  iterator::iterator((iterator *)this,starter);
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::begin(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("begin"));
	   makeUniqueInternal();
	   return json_iterator(internal -> begin());
    }